

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int b64_pton(char *src,uchar *target,size_t targsize)

{
  int __c;
  ushort **ppuVar1;
  char *pcVar2;
  char *pcVar3;
  ulong in_RDX;
  long in_RSI;
  char *in_RDI;
  char *pos;
  int ch;
  int state;
  int tarindex;
  int local_2c;
  uint local_28;
  int local_24;
  char *local_10;
  
  local_28 = 0;
  local_24 = 0;
  pcVar3 = in_RDI;
  while( true ) {
    local_10 = pcVar3;
    pcVar3 = local_10 + 1;
    __c = (int)*local_10;
    if (__c == 0) break;
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[__c] & 0x2000) == 0) {
      if (__c == 0x3d) break;
      pcVar2 = strchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",__c);
      if (pcVar2 == (char *)0x0) {
        return -1;
      }
      switch(local_28) {
      case 0:
        if (in_RSI != 0) {
          if (in_RDX <= (ulong)(long)local_24) {
            return -1;
          }
          *(char *)(in_RSI + local_24) = ((char)pcVar2 + ' ') * '\x04';
        }
        local_28 = 1;
        break;
      case 1:
        if (in_RSI != 0) {
          if (in_RDX <= (long)local_24 + 1U) {
            return -1;
          }
          *(byte *)(in_RSI + local_24) =
               *(byte *)(in_RSI + local_24) | (byte)((long)(pcVar2 + -0x1045e0) >> 4);
          *(char *)(in_RSI + (local_24 + 1)) = (char)(((ulong)(pcVar2 + -0x1045e0) & 0xf) << 4);
        }
        local_24 = local_24 + 1;
        local_28 = 2;
        break;
      case 2:
        if (in_RSI != 0) {
          if (in_RDX <= (long)local_24 + 1U) {
            return -1;
          }
          *(byte *)(in_RSI + local_24) =
               *(byte *)(in_RSI + local_24) | (byte)((long)(pcVar2 + -0x1045e0) >> 2);
          *(char *)(in_RSI + (local_24 + 1)) = (char)(((ulong)(pcVar2 + -0x1045e0) & 3) << 6);
        }
        local_24 = local_24 + 1;
        local_28 = 3;
        break;
      case 3:
        if (in_RSI != 0) {
          if (in_RDX <= (ulong)(long)local_24) {
            return -1;
          }
          *(byte *)(in_RSI + local_24) = *(byte *)(in_RSI + local_24) | (char)pcVar2 + 0x20U;
        }
        local_24 = local_24 + 1;
        local_28 = 0;
        break;
      default:
        abort();
      }
    }
  }
  if (__c == 0x3d) {
    local_10 = local_10 + 2;
    local_2c = (int)*pcVar3;
    if (local_28 < 2) {
      return -1;
    }
    if (local_28 == 2) {
      while ((local_2c != 0 && (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[local_2c] & 0x2000) != 0))) {
        local_2c = (int)*local_10;
        local_10 = local_10 + 1;
      }
      if (local_2c != 0x3d) {
        return -1;
      }
      local_2c = (int)*local_10;
      local_10 = local_10 + 1;
    }
    else if (local_28 != 3) {
      return local_24;
    }
    while (local_2c != 0) {
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[local_2c] & 0x2000) == 0) {
        return -1;
      }
      local_2c = (int)*local_10;
      local_10 = local_10 + 1;
    }
    if ((in_RSI != 0) && (*(char *)(in_RSI + local_24) != '\0')) {
      return -1;
    }
  }
  else if (local_28 != 0) {
    return -1;
  }
  return local_24;
}

Assistant:

int
b64_pton(char const *src, unsigned char *target, size_t targsize) {
	int tarindex, state, ch;
	char *pos;

	state = 0;
	tarindex = 0;

	while ((ch = *src++) != '\0') {
		if (isspace(ch))	/* Skip whitespace anywhere. */
			continue;

		if (ch == Pad64)
			break;

		pos = strchr(Base64, ch);
		if (pos == 0) 		/* A non-base64 character. */
			return (-1);

		switch (state) {
		case 0:
			if (target) {
				if ((size_t)tarindex >= targsize)
					return (-1);
				target[tarindex] = (pos - Base64) << 2;
			}
			state = 1;
			break;
		case 1:
			if (target) {
				if ((size_t)tarindex + 1 >= targsize)
					return (-1);
				target[tarindex]   |=  (pos - Base64) >> 4;
				target[tarindex+1]  = ((pos - Base64) & 0x0f)
							<< 4 ;
			}
			tarindex++;
			state = 2;
			break;
		case 2:
			if (target) {
				if ((size_t)tarindex + 1 >= targsize)
					return (-1);
				target[tarindex]   |=  (pos - Base64) >> 2;
				target[tarindex+1]  = ((pos - Base64) & 0x03)
							<< 6;
			}
			tarindex++;
			state = 3;
			break;
		case 3:
			if (target) {
				if ((size_t)tarindex >= targsize)
					return (-1);
				target[tarindex] |= (pos - Base64);
			}
			tarindex++;
			state = 0;
			break;
		default:
			abort();
		}
	}

	/*
	 * We are done decoding Base-64 chars.  Let's see if we ended
	 * on a byte boundary, and/or with erroneous trailing characters.
	 */

	if (ch == Pad64) {		/* We got a pad char. */
		ch = *src++;		/* Skip it, get next. */
		switch (state) {
		case 0:		/* Invalid = in first position */
		case 1:		/* Invalid = in second position */
			return (-1);

		case 2:		/* Valid, means one byte of info */
			/* Skip any number of spaces. */
			for ((void)NULL; ch != '\0'; ch = *src++)
				if (!isspace(ch))
					break;
			/* Make sure there is another trailing = sign. */
			if (ch != Pad64)
				return (-1);
			ch = *src++;		/* Skip the = */
			/* Fall through to "single trailing =" case. */
			/* FALLTHROUGH */

		case 3:		/* Valid, means two bytes of info */
			/*
			 * We know this char is an =.  Is there anything but
			 * whitespace after it?
			 */
			for ((void)NULL; ch != '\0'; ch = *src++)
				if (!isspace(ch))
					return (-1);

			/*
			 * Now make sure for cases 2 and 3 that the "extra"
			 * bits that slopped past the last full byte were
			 * zeros.  If we don't check them, they become a
			 * subliminal channel.
			 */
			if (target && target[tarindex] != 0)
				return (-1);
		}
	} else {
		/*
		 * We ended by seeing the end of the string.  Make sure we
		 * have no partial bytes lying around.
		 */
		if (state != 0)
			return (-1);
	}

	return (tarindex);
}